

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_avx2.c
# Opt level: O0

void nn_propagate_8to4(float *inputs,float *weights,float *bias,int num_inputs_to_process,
                      int tot_num_inputs,int num_outputs,float *output_nodes,int is_clip_required)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  int iVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  __m128 high_128;
  __m128 low_128;
  __m256 sum_par;
  __m256 mul1;
  __m256 mul0;
  __m256 weight1;
  __m256 weight0;
  int index;
  int i;
  int weight_idx;
  __m256 inputs256;
  int in;
  __m128 in_result;
  __m128 bias_reg;
  int out;
  __m256 hadd [2];
  int local_328;
  int local_2f4;
  undefined1 local_2f0 [8];
  undefined8 uStack_2e8;
  int local_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  ulong uStack_228;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  
  for (local_2c4 = 0; local_2c4 < in_R9D; local_2c4 = local_2c4 + 4) {
    puVar14 = (undefined8 *)(in_RDX + (long)local_2c4 * 4);
    uVar2 = *puVar14;
    uVar3 = puVar14[1];
    uStack_228 = SUB168(ZEXT816(0),4);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uStack_228;
    _local_2f0 = auVar12 << 0x40;
    for (local_2f4 = 0; local_1d0 = local_2f0._0_4_, fStack_1cc = local_2f0._4_4_,
        fStack_1c8 = local_2f0._8_4_, fStack_1c4 = local_2f0._12_4_, local_2f4 < in_ECX;
        local_2f4 = local_2f4 + 8) {
      puVar14 = (undefined8 *)(in_RDI + (long)local_2f4 * 4);
      uVar4 = *puVar14;
      uVar5 = puVar14[1];
      uVar6 = puVar14[2];
      uVar7 = puVar14[3];
      for (local_328 = 0; local_328 < 2; local_328 = local_328 + 1) {
        iVar13 = local_2f4 + local_2c4 * in_R8D + local_328 * 2 * in_R8D;
        puVar14 = (undefined8 *)(in_RSI + (long)iVar13 * 4);
        puVar15 = (undefined8 *)(in_RSI + (long)(iVar13 + in_R8D) * 4);
        local_100 = (float)uVar4;
        fStack_fc = (float)((ulong)uVar4 >> 0x20);
        fStack_f8 = (float)uVar5;
        fStack_f4 = (float)((ulong)uVar5 >> 0x20);
        fStack_f0 = (float)uVar6;
        fStack_ec = (float)((ulong)uVar6 >> 0x20);
        fStack_e8 = (float)uVar7;
        uStack_e4 = (undefined4)((ulong)uVar7 >> 0x20);
        local_120 = (float)*puVar14;
        fStack_11c = (float)((ulong)*puVar14 >> 0x20);
        fStack_118 = (float)puVar14[1];
        fStack_114 = (float)((ulong)puVar14[1] >> 0x20);
        fStack_110 = (float)puVar14[2];
        fStack_10c = (float)((ulong)puVar14[2] >> 0x20);
        fStack_108 = (float)puVar14[3];
        local_160 = (float)*puVar15;
        fStack_15c = (float)((ulong)*puVar15 >> 0x20);
        fStack_158 = (float)puVar15[1];
        fStack_154 = (float)((ulong)puVar15[1] >> 0x20);
        fStack_150 = (float)puVar15[2];
        fStack_14c = (float)((ulong)puVar15[2] >> 0x20);
        fStack_148 = (float)puVar15[3];
        auVar11._4_4_ = fStack_fc * fStack_11c;
        auVar11._0_4_ = local_100 * local_120;
        auVar11._12_4_ = fStack_f4 * fStack_114;
        auVar11._8_4_ = fStack_f8 * fStack_118;
        auVar11._20_4_ = fStack_ec * fStack_10c;
        auVar11._16_4_ = fStack_f0 * fStack_110;
        auVar11._28_4_ = uStack_e4;
        auVar11._24_4_ = fStack_e8 * fStack_108;
        auVar10._4_4_ = fStack_fc * fStack_15c;
        auVar10._0_4_ = local_100 * local_160;
        auVar10._12_4_ = fStack_f4 * fStack_154;
        auVar10._8_4_ = fStack_f8 * fStack_158;
        auVar10._20_4_ = fStack_ec * fStack_14c;
        auVar10._16_4_ = fStack_f0 * fStack_150;
        auVar10._28_4_ = uStack_e4;
        auVar10._24_4_ = fStack_e8 * fStack_148;
        auVar1 = vhaddps_avx(auVar11,auVar10);
        *(undefined1 (*) [32])(&local_2c0 + (long)local_328 * 4) = auVar1;
      }
      auVar9._8_8_ = uStack_2b8;
      auVar9._0_8_ = local_2c0;
      auVar9._16_8_ = uStack_2b0;
      auVar9._24_8_ = uStack_2a8;
      auVar1._8_8_ = uStack_298;
      auVar1._0_8_ = local_2a0;
      auVar1._16_8_ = uStack_290;
      auVar1._24_8_ = uStack_288;
      auVar1 = vhaddps_avx(auVar9,auVar1);
      local_190 = auVar1._0_4_;
      fStack_18c = auVar1._4_4_;
      fStack_188 = auVar1._8_4_;
      fStack_184 = auVar1._12_4_;
      local_1a0 = auVar1._16_4_;
      fStack_19c = auVar1._20_4_;
      fStack_198 = auVar1._24_4_;
      fStack_194 = auVar1._28_4_;
      local_2f0._4_4_ = fStack_1cc + fStack_18c + fStack_19c;
      local_2f0._0_4_ = local_1d0 + local_190 + local_1a0;
      uStack_2e8._0_4_ = fStack_1c8 + fStack_188 + fStack_198;
      uStack_2e8._4_4_ = fStack_1c4 + fStack_184 + fStack_194;
    }
    local_1e0 = (float)uVar2;
    fStack_1dc = (float)((ulong)uVar2 >> 0x20);
    fStack_1d8 = (float)uVar3;
    fStack_1d4 = (float)((ulong)uVar3 >> 0x20);
    local_2f0._4_4_ = fStack_1cc + fStack_1dc;
    local_2f0._0_4_ = local_1d0 + local_1e0;
    uStack_2e8._0_4_ = fStack_1c8 + fStack_1d8;
    uStack_2e8._4_4_ = fStack_1c4 + fStack_1d4;
    if ((int)output_nodes != 0) {
      auVar8._8_8_ = uStack_2e8;
      auVar8._0_8_ = local_2f0;
      _local_2f0 = vmaxps_avx(auVar8,ZEXT816(0));
    }
    puVar14 = (undefined8 *)(in_stack_00000008 + (long)local_2c4 * 4);
    *puVar14 = local_2f0;
    puVar14[1] = uStack_2e8;
  }
  return;
}

Assistant:

static inline void nn_propagate_8to4(
    const float *const inputs, const float *const weights,
    const float *const bias, int num_inputs_to_process, int tot_num_inputs,
    int num_outputs, float *const output_nodes, int is_clip_required) {
  __m256 hadd[2];
  for (int out = 0; out < num_outputs; out += 4) {
    __m128 bias_reg = _mm_loadu_ps(&bias[out]);
    __m128 in_result = _mm_setzero_ps();
    for (int in = 0; in < num_inputs_to_process; in += 8) {
      const __m256 inputs256 = _mm256_loadu_ps(&inputs[in]);
      const int weight_idx = in + (out * tot_num_inputs);
      // Process two output row at a time.
      for (int i = 0; i < 2; i++) {
        CALC_OUTPUT_FOR_2ROWS
      }

      const __m256 sum_par = _mm256_hadd_ps(hadd[0], hadd[1]);
      const __m128 low_128 = _mm256_castps256_ps128(sum_par);
      const __m128 high_128 = _mm256_extractf128_ps(sum_par, 1);
      const __m128 result = _mm_add_ps(low_128, high_128);

      in_result = _mm_add_ps(in_result, result);
    }

    in_result = _mm_add_ps(in_result, bias_reg);
    if (is_clip_required) in_result = _mm_max_ps(in_result, _mm_setzero_ps());
    _mm_storeu_ps(&output_nodes[out], in_result);
  }
}